

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int nsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlGenericErrorFunc p_Var1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  
  iVar3 = (int)in_RAX;
  if (ctxt->nsTab != (xmlChar **)0x0) {
    if (ctxt->nsNr < nr) {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      in_RAX = (*p_Var1)(*ppvVar5,"Pbm popping %d NS\n",nr);
      nr = ctxt->nsNr;
    }
    bVar2 = 0 < ctxt->nsNr;
    iVar3 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),bVar2);
    if (0 < nr && bVar2) {
      iVar3 = ctxt->nsNr;
      lVar6 = (long)iVar3;
      iVar7 = 0;
      do {
        lVar6 = lVar6 + -1;
        ctxt->nsTab[lVar6] = (xmlChar *)0x0;
        iVar7 = iVar7 + 1;
      } while (nr != iVar7);
      iVar3 = iVar3 - iVar7;
      ctxt->nsNr = iVar3;
    }
  }
  return iVar3;
}

Assistant:

static int
nsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    if (ctxt->nsTab == NULL) return(0);
    if (ctxt->nsNr < nr) {
        xmlGenericError(xmlGenericErrorContext, "Pbm popping %d NS\n", nr);
        nr = ctxt->nsNr;
    }
    if (ctxt->nsNr <= 0)
        return (0);

    for (i = 0;i < nr;i++) {
         ctxt->nsNr--;
	 ctxt->nsTab[ctxt->nsNr] = NULL;
    }
    return(nr);
}